

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3WhereEnd(WhereInfo *pWInfo)

{
  byte bVar1;
  ushort uVar2;
  Parse *pParse;
  SrcList *pSVar3;
  sqlite3 *db;
  Vdbe *p;
  WhereLoop *pWVar4;
  int *piVar5;
  Table *pTVar6;
  Index *pIVar7;
  Index *pIVar8;
  bool bVar9;
  u8 uVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  Op *pOVar15;
  anon_union_16_2_dad992c1_for_u *paVar16;
  WhereLevel *pWVar17;
  int iVar18;
  uint uVar19;
  u8 *puVar20;
  Index **ppIVar21;
  ulong uVar22;
  uint uVar23;
  
  pParse = pWInfo->pParse;
  pSVar3 = pWInfo->pTabList;
  db = pParse->db;
  p = pParse->pVdbe;
  uVar22 = (ulong)pWInfo->nLevel;
  if (uVar22 != 0) {
    do {
      pWVar17 = pWInfo->a + (uVar22 - 1);
      pWVar4 = pWInfo->a[uVar22 - 1].pWLoop;
      if (pWInfo->a[uVar22 - 1].op == 0xab) {
        piVar5 = p->pParse->aLabel;
        if (piVar5 != (int *)0x0) {
          piVar5[~(long)pWVar17->addrCont] = p->nOp;
        }
      }
      else {
        iVar12 = 0;
        iVar18 = 0;
        if ((((pWInfo->eDistinct == '\x02') && (uVar22 == pWInfo->nLevel)) &&
            ((pWVar4->wsFlags & 0x200) != 0)) &&
           (pIVar7 = (pWVar4->u).btree.pIndex, iVar12 = iVar18, (pIVar7->field_0x63 & 0x80) != 0)) {
          uVar2 = (pWVar4->u).btree.nIdxCol;
          if ((uVar2 != 0) && (uVar23 = (uint)uVar2, 0x23 < pIVar7->aiRowLogEst[uVar2])) {
            iVar12 = pParse->nMem + 1;
            uVar19 = 0;
            do {
              sqlite3VdbeAddOp3(p,0x5a,pWVar17->iIdxCur,uVar19,iVar12 + uVar19);
              uVar19 = uVar19 + 1;
            } while (uVar23 != uVar19);
            pParse->nMem = pParse->nMem + uVar23 + 1;
            iVar12 = sqlite3VdbeAddOp3(p,(uint)(pWVar17->op != '\x04') * 3 + 0x16,pWVar17->iIdxCur,0
                                       ,iVar12);
            if (p->db->mallocFailed == '\0') {
              pOVar15 = p->aOp;
              pOVar15[iVar12].p4type = -3;
              pOVar15[iVar12].p4.i = uVar23;
            }
            sqlite3VdbeAddOp3(p,0xb,1,pWVar17->p2,0);
          }
        }
        piVar5 = p->pParse->aLabel;
        if (piVar5 != (int *)0x0) {
          piVar5[~(long)pWVar17->addrCont] = p->nOp;
        }
        sqlite3VdbeAddOp3(p,(uint)pWVar17->op,pWVar17->p1,pWVar17->p2,(uint)pWVar17->p3);
        iVar18 = p->nOp;
        if (0 < (long)iVar18) {
          p->aOp[(long)iVar18 + -1].p5 = (ushort)pWVar17->p5;
        }
        if (iVar12 != 0) {
          pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
          if (p->db->mallocFailed == '\0') {
            iVar13 = iVar18 + -1;
            if (-1 < iVar12) {
              iVar13 = iVar12;
            }
            pOVar15 = p->aOp + iVar13;
          }
          pOVar15->p2 = iVar18;
        }
      }
      if (((pWVar4->wsFlags & 0x800) != 0) && (uVar23 = (pWVar17->u).in.nIn, 0 < (int)uVar23)) {
        piVar5 = p->pParse->aLabel;
        if (piVar5 != (int *)0x0) {
          piVar5[~(long)pWVar17->addrNxt] = p->nOp;
          uVar23 = (pWVar17->u).in.nIn;
          if ((int)uVar23 < 1) goto LAB_0017760e;
        }
        iVar12 = p->nOp;
        uVar10 = p->db->mallocFailed;
        iVar18 = uVar23 + 1;
        puVar20 = &(pWVar17->u).in.aInLoop[(ulong)uVar23 - 1].eEndLoopOp;
        do {
          pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
          if (uVar10 == '\0') {
            iVar13 = iVar12 + -1;
            if (-2 < *(int *)(puVar20 + -0xc)) {
              iVar13 = *(int *)(puVar20 + -0xc) + 1;
            }
            pOVar15 = p->aOp + iVar13;
          }
          pOVar15->p2 = iVar12;
          if (*puVar20 != 0xab) {
            iVar13 = *(int *)(puVar20 + -4);
            if ((iVar13 != 0) &&
               (iVar12 = sqlite3VdbeAddOp3(p,0x1a,pWVar17->iIdxCur,iVar12 + 2,*(int *)(puVar20 + -8)
                                          ), p->db->mallocFailed == '\0')) {
              pOVar15 = p->aOp;
              pOVar15[iVar12].p4type = -3;
              pOVar15[iVar12].p4.i = iVar13;
            }
            sqlite3VdbeAddOp3(p,(uint)*puVar20,((InLoop *)(puVar20 + -0x10))->iCur,
                              *(int *)(puVar20 + -0xc),0);
            iVar12 = p->nOp;
            uVar10 = p->db->mallocFailed;
          }
          pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
          if (uVar10 == '\0') {
            iVar13 = *(int *)(puVar20 + -0xc);
            if (*(int *)(puVar20 + -0xc) < 1) {
              iVar13 = iVar12;
            }
            pOVar15 = p->aOp + (long)iVar13 + -1;
          }
          pOVar15->p2 = iVar12;
          iVar18 = iVar18 + -1;
          puVar20 = puVar20 + -0x14;
        } while (1 < iVar18);
      }
LAB_0017760e:
      piVar5 = p->pParse->aLabel;
      if (piVar5 != (int *)0x0) {
        piVar5[~(long)pWVar17->addrBrk] = p->nOp;
      }
      if (pWVar17->addrSkip != 0) {
        sqlite3VdbeAddOp3(p,0xb,0,pWVar17->addrSkip,0);
        iVar12 = p->nOp;
        if (p->db->mallocFailed == '\0') {
          iVar18 = pWVar17->addrSkip;
          iVar13 = iVar18;
          if (iVar18 < 0) {
            iVar13 = iVar12 + -1;
          }
          pOVar15 = p->aOp;
          iVar14 = iVar18 + -2;
          if (iVar18 < 2) {
            iVar14 = iVar12 + -1;
          }
          pOVar15[iVar13].p2 = iVar12;
          pOVar15 = pOVar15 + iVar14;
        }
        else {
          pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
          DAT_001c0350 = iVar12;
        }
        pOVar15->p2 = iVar12;
      }
      if (pWVar17->addrLikeRep != 0) {
        sqlite3VdbeAddOp3(p,0x31,pWVar17->iLikeRepCntr >> 1,pWVar17->addrLikeRep,0);
      }
      if (pWVar17->iLeftJoin != 0) {
        uVar23 = pWVar4->wsFlags;
        iVar12 = sqlite3VdbeAddOp3(p,0x2f,pWVar17->iLeftJoin,0,0);
        if ((uVar23 & 0x40) == 0) {
          sqlite3VdbeAddOp3(p,0x82,pWVar17->iTabCur,0,0);
        }
        if (((uVar23 >> 9 & 1) != 0) ||
           (((uVar23 >> 0xd & 1) != 0 && ((pWVar17->u).pCovidx != (Index *)0x0)))) {
          sqlite3VdbeAddOp3(p,0x82,pWVar17->iIdxCur,0,0);
        }
        if (pWVar17->op == 'B') {
          iVar18 = pWVar17->addrFirst;
          iVar13 = pWVar17->p1;
          iVar14 = 0xc;
        }
        else {
          iVar18 = pWVar17->addrFirst;
          iVar14 = 0xb;
          iVar13 = 0;
        }
        sqlite3VdbeAddOp3(p,iVar14,iVar13,iVar18,0);
        pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
        if (p->db->mallocFailed == '\0') {
          iVar18 = p->nOp + -1;
          if (-1 < iVar12) {
            iVar18 = iVar12;
          }
          pOVar15 = p->aOp + iVar18;
        }
        pOVar15->p2 = p->nOp;
      }
      bVar9 = 1 < (long)uVar22;
      uVar22 = uVar22 - 1;
    } while (bVar9);
  }
  piVar5 = p->pParse->aLabel;
  if (piVar5 != (int *)0x0) {
    piVar5[~(long)pWInfo->iBreak] = p->nOp;
  }
  bVar11 = pWInfo->nLevel;
  if (bVar11 != 0) {
    pWVar17 = pWInfo->a;
    uVar23 = 0;
    do {
      bVar1 = pWVar17->iFrom;
      if ((pSVar3->a[bVar1].fg.field_0x1 & 0x10) == 0) {
        pTVar6 = pSVar3->a[bVar1].pTab;
        uVar19 = pWVar17->pWLoop->wsFlags;
        if ((uVar19 & 0x240) == 0) {
          if ((uVar19 >> 0xd & 1) == 0) goto LAB_0017796d;
          paVar16 = &pWVar17->u;
        }
        else {
          paVar16 = (anon_union_16_2_dad992c1_for_u *)&(pWVar17->pWLoop->u).btree.pIndex;
        }
        pIVar7 = paVar16->pCovidx;
        if ((pIVar7 != (Index *)0x0) &&
           (((pWInfo->eOnePass == '\0' || ((pIVar7->pTable->tabFlags & 0x20) != 0)) &&
            (db->mallocFailed == '\0')))) {
          iVar12 = p->nOp;
          iVar18 = pWVar17->addrBody;
          pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
          if (p->db->mallocFailed == '\0') {
            iVar13 = iVar12 + -1;
            if (-1 < iVar18) {
              iVar13 = iVar18;
            }
            pOVar15 = p->aOp + iVar13;
          }
          if (iVar18 < iVar12) {
            iVar13 = pWVar17->iTabCur;
            do {
              if (pOVar15->p1 == iVar13) {
                uVar10 = pOVar15->opcode;
                if (uVar10 == '\x15') {
LAB_0017793f:
                  pOVar15->p1 = pWVar17->iIdxCur;
                }
                else if (uVar10 == 0x81) {
                  pOVar15->p1 = pWVar17->iIdxCur;
                  pOVar15->opcode = 0x88;
                }
                else if (uVar10 == 'Z') {
                  uVar19 = pOVar15->p2;
                  if ((pTVar6->tabFlags & 0x20) != 0) {
                    ppIVar21 = &pTVar6->pIndex;
                    do {
                      pIVar8 = *ppIVar21;
                      ppIVar21 = &pIVar8->pNext;
                    } while ((*(ushort *)&pIVar8->field_0x63 & 3) != 2);
                    uVar19 = (uint)(ushort)pIVar8->aiColumn[(int)uVar19];
                  }
                  if ((ulong)pIVar7->nColumn != 0) {
                    uVar22 = 0;
                    do {
                      if (pIVar7->aiColumn[uVar22] == (short)uVar19) {
                        if (-1 < (short)uVar22) {
                          pOVar15->p2 = (uint)uVar22 & 0x7fff;
                          goto LAB_0017793f;
                        }
                        break;
                      }
                      uVar22 = uVar22 + 1;
                    } while (pIVar7->nColumn != uVar22);
                  }
                }
              }
              iVar18 = iVar18 + 1;
              pOVar15 = pOVar15 + 1;
            } while (iVar18 != iVar12);
          }
        }
      }
      else {
        translateColumnToCopy
                  (pParse,pWVar17->addrBody,pWVar17->iTabCur,pSVar3->a[bVar1].regResult,0);
        bVar11 = pWInfo->nLevel;
      }
LAB_0017796d:
      uVar23 = uVar23 + 1;
      pWVar17 = pWVar17 + 1;
    } while (uVar23 < bVar11);
  }
  pParse->nQueryLoop = pWInfo->savedNQueryLoop;
  whereInfoFree(db,pWInfo);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereEnd(WhereInfo *pWInfo){
  Parse *pParse = pWInfo->pParse;
  Vdbe *v = pParse->pVdbe;
  int i;
  WhereLevel *pLevel;
  WhereLoop *pLoop;
  SrcList *pTabList = pWInfo->pTabList;
  sqlite3 *db = pParse->db;

  /* Generate loop termination code.
  */
  VdbeModuleComment((v, "End WHERE-core"));
  for(i=pWInfo->nLevel-1; i>=0; i--){
    int addr;
    pLevel = &pWInfo->a[i];
    pLoop = pLevel->pWLoop;
    if( pLevel->op!=OP_Noop ){
#ifndef SQLITE_DISABLE_SKIPAHEAD_DISTINCT
      int addrSeek = 0;
      Index *pIdx;
      int n;
      if( pWInfo->eDistinct==WHERE_DISTINCT_ORDERED
       && i==pWInfo->nLevel-1  /* Ticket [ef9318757b152e3] 2017-10-21 */
       && (pLoop->wsFlags & WHERE_INDEXED)!=0
       && (pIdx = pLoop->u.btree.pIndex)->hasStat1
       && (n = pLoop->u.btree.nIdxCol)>0
       && pIdx->aiRowLogEst[n]>=36
      ){
        int r1 = pParse->nMem+1;
        int j, op;
        for(j=0; j<n; j++){
          sqlite3VdbeAddOp3(v, OP_Column, pLevel->iIdxCur, j, r1+j);
        }
        pParse->nMem += n+1;
        op = pLevel->op==OP_Prev ? OP_SeekLT : OP_SeekGT;
        addrSeek = sqlite3VdbeAddOp4Int(v, op, pLevel->iIdxCur, 0, r1, n);
        VdbeCoverageIf(v, op==OP_SeekLT);
        VdbeCoverageIf(v, op==OP_SeekGT);
        sqlite3VdbeAddOp2(v, OP_Goto, 1, pLevel->p2);
      }
#endif /* SQLITE_DISABLE_SKIPAHEAD_DISTINCT */
      /* The common case: Advance to the next row */
      sqlite3VdbeResolveLabel(v, pLevel->addrCont);
      sqlite3VdbeAddOp3(v, pLevel->op, pLevel->p1, pLevel->p2, pLevel->p3);
      sqlite3VdbeChangeP5(v, pLevel->p5);
      VdbeCoverage(v);
      VdbeCoverageIf(v, pLevel->op==OP_Next);
      VdbeCoverageIf(v, pLevel->op==OP_Prev);
      VdbeCoverageIf(v, pLevel->op==OP_VNext);
#ifndef SQLITE_DISABLE_SKIPAHEAD_DISTINCT
      if( addrSeek ) sqlite3VdbeJumpHere(v, addrSeek);
#endif
    }else{
      sqlite3VdbeResolveLabel(v, pLevel->addrCont);
    }
    if( pLoop->wsFlags & WHERE_IN_ABLE && pLevel->u.in.nIn>0 ){
      struct InLoop *pIn;
      int j;
      sqlite3VdbeResolveLabel(v, pLevel->addrNxt);
      for(j=pLevel->u.in.nIn, pIn=&pLevel->u.in.aInLoop[j-1]; j>0; j--, pIn--){
        sqlite3VdbeJumpHere(v, pIn->addrInTop+1);
        if( pIn->eEndLoopOp!=OP_Noop ){
          if( pIn->nPrefix ){
            assert( pLoop->wsFlags & WHERE_IN_EARLYOUT );
            sqlite3VdbeAddOp4Int(v, OP_IfNoHope, pLevel->iIdxCur,
                              sqlite3VdbeCurrentAddr(v)+2,
                              pIn->iBase, pIn->nPrefix);
            VdbeCoverage(v);
          }
          sqlite3VdbeAddOp2(v, pIn->eEndLoopOp, pIn->iCur, pIn->addrInTop);
          VdbeCoverage(v);
          VdbeCoverageIf(v, pIn->eEndLoopOp==OP_Prev);
          VdbeCoverageIf(v, pIn->eEndLoopOp==OP_Next);
        }
        sqlite3VdbeJumpHere(v, pIn->addrInTop-1);
      }
    }
    sqlite3VdbeResolveLabel(v, pLevel->addrBrk);
    if( pLevel->addrSkip ){
      sqlite3VdbeGoto(v, pLevel->addrSkip);
      VdbeComment((v, "next skip-scan on %s", pLoop->u.btree.pIndex->zName));
      sqlite3VdbeJumpHere(v, pLevel->addrSkip);
      sqlite3VdbeJumpHere(v, pLevel->addrSkip-2);
    }
#ifndef SQLITE_LIKE_DOESNT_MATCH_BLOBS
    if( pLevel->addrLikeRep ){
      sqlite3VdbeAddOp2(v, OP_DecrJumpZero, (int)(pLevel->iLikeRepCntr>>1),
                        pLevel->addrLikeRep);
      VdbeCoverage(v);
    }
#endif
    if( pLevel->iLeftJoin ){
      int ws = pLoop->wsFlags;
      addr = sqlite3VdbeAddOp1(v, OP_IfPos, pLevel->iLeftJoin); VdbeCoverage(v);
      assert( (ws & WHERE_IDX_ONLY)==0 || (ws & WHERE_INDEXED)!=0 );
      if( (ws & WHERE_IDX_ONLY)==0 ){
        assert( pLevel->iTabCur==pTabList->a[pLevel->iFrom].iCursor );
        sqlite3VdbeAddOp1(v, OP_NullRow, pLevel->iTabCur);
      }
      if( (ws & WHERE_INDEXED) 
       || ((ws & WHERE_MULTI_OR) && pLevel->u.pCovidx) 
      ){
        sqlite3VdbeAddOp1(v, OP_NullRow, pLevel->iIdxCur);
      }
      if( pLevel->op==OP_Return ){
        sqlite3VdbeAddOp2(v, OP_Gosub, pLevel->p1, pLevel->addrFirst);
      }else{
        sqlite3VdbeGoto(v, pLevel->addrFirst);
      }
      sqlite3VdbeJumpHere(v, addr);
    }
    VdbeModuleComment((v, "End WHERE-loop%d: %s", i,
                     pWInfo->pTabList->a[pLevel->iFrom].pTab->zName));
  }

  /* The "break" point is here, just past the end of the outer loop.
  ** Set it.
  */
  sqlite3VdbeResolveLabel(v, pWInfo->iBreak);

  assert( pWInfo->nLevel<=pTabList->nSrc );
  for(i=0, pLevel=pWInfo->a; i<pWInfo->nLevel; i++, pLevel++){
    int k, last;
    VdbeOp *pOp;
    Index *pIdx = 0;
    struct SrcList_item *pTabItem = &pTabList->a[pLevel->iFrom];
    Table *pTab = pTabItem->pTab;
    assert( pTab!=0 );
    pLoop = pLevel->pWLoop;

    /* For a co-routine, change all OP_Column references to the table of
    ** the co-routine into OP_Copy of result contained in a register.
    ** OP_Rowid becomes OP_Null.
    */
    if( pTabItem->fg.viaCoroutine ){
      testcase( pParse->db->mallocFailed );
      translateColumnToCopy(pParse, pLevel->addrBody, pLevel->iTabCur,
                            pTabItem->regResult, 0);
      continue;
    }

    /* If this scan uses an index, make VDBE code substitutions to read data
    ** from the index instead of from the table where possible.  In some cases
    ** this optimization prevents the table from ever being read, which can
    ** yield a significant performance boost.
    ** 
    ** Calls to the code generator in between sqlite3WhereBegin and
    ** sqlite3WhereEnd will have created code that references the table
    ** directly.  This loop scans all that code looking for opcodes
    ** that reference the table and converts them into opcodes that
    ** reference the index.
    */
    if( pLoop->wsFlags & (WHERE_INDEXED|WHERE_IDX_ONLY) ){
      pIdx = pLoop->u.btree.pIndex;
    }else if( pLoop->wsFlags & WHERE_MULTI_OR ){
      pIdx = pLevel->u.pCovidx;
    }
    if( pIdx
     && (pWInfo->eOnePass==ONEPASS_OFF || !HasRowid(pIdx->pTable))
     && !db->mallocFailed
    ){
      last = sqlite3VdbeCurrentAddr(v);
      k = pLevel->addrBody;
#ifdef SQLITE_DEBUG
      if( db->flags & SQLITE_VdbeAddopTrace ){
        printf("TRANSLATE opcodes in range %d..%d\n", k, last-1);
      }
#endif
      pOp = sqlite3VdbeGetOp(v, k);
      for(; k<last; k++, pOp++){
        if( pOp->p1!=pLevel->iTabCur ) continue;
        if( pOp->opcode==OP_Column
#ifdef SQLITE_ENABLE_OFFSET_SQL_FUNC
         || pOp->opcode==OP_Offset
#endif
        ){
          int x = pOp->p2;
          assert( pIdx->pTable==pTab );
          if( !HasRowid(pTab) ){
            Index *pPk = sqlite3PrimaryKeyIndex(pTab);
            x = pPk->aiColumn[x];
            assert( x>=0 );
          }
          x = sqlite3ColumnOfIndex(pIdx, x);
          if( x>=0 ){
            pOp->p2 = x;
            pOp->p1 = pLevel->iIdxCur;
            OpcodeRewriteTrace(db, k, pOp);
          }
          assert( (pLoop->wsFlags & WHERE_IDX_ONLY)==0 || x>=0 
              || pWInfo->eOnePass );
        }else if( pOp->opcode==OP_Rowid ){
          pOp->p1 = pLevel->iIdxCur;
          pOp->opcode = OP_IdxRowid;
          OpcodeRewriteTrace(db, k, pOp);
        }else if( pOp->opcode==OP_IfNullRow ){
          pOp->p1 = pLevel->iIdxCur;
          OpcodeRewriteTrace(db, k, pOp);
        }
      }
#ifdef SQLITE_DEBUG
      if( db->flags & SQLITE_VdbeAddopTrace ) printf("TRANSLATE complete\n");
#endif
    }
  }

  /* Final cleanup
  */
  pParse->nQueryLoop = pWInfo->savedNQueryLoop;
  whereInfoFree(db, pWInfo);
  return;
}